

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O2

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  uint _h_00;
  pointer pMVar1;
  Mat *this_00;
  size_t sVar2;
  int j_2;
  uint _w;
  long lVar3;
  long lVar4;
  int *piVar5;
  void *pvVar6;
  ulong uVar7;
  int iVar8;
  void *pvVar9;
  pointer pMVar10;
  pointer pMVar11;
  ulong uVar12;
  int i_4;
  int i_3;
  int iVar13;
  int iVar14;
  void *pvVar15;
  ulong uVar16;
  int j_3;
  ulong uVar17;
  long lVar18;
  long lVar19;
  pointer pMVar20;
  int j;
  ulong uVar21;
  float sum;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 in_XMM1 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  void *local_238;
  long local_230;
  long local_228;
  int *local_218;
  long *local_210;
  int local_204;
  long local_200;
  int *local_1f0;
  Mat local_1e8;
  Mat *local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  ulong local_178;
  pointer local_170;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar1;
  pMVar20 = pMVar1;
  if (lVar3 == 0x48) {
    iVar8 = this->attn_mask;
    pMVar10 = pMVar1;
LAB_00483e10:
    pMVar11 = pMVar10;
    if (iVar8 == 0) {
      local_238 = (void *)0x0;
      local_218 = (int *)0x0;
      local_230 = 0;
      local_210 = (long *)0x0;
      local_204 = 0;
      iVar8 = 0;
      local_200 = 0;
      goto LAB_00483ed1;
    }
  }
  else {
    iVar8 = this->attn_mask;
    pMVar10 = pMVar1 + 1;
    pMVar11 = pMVar1;
    if (iVar8 == 0 || lVar3 != 0x90) {
      pMVar20 = pMVar10;
      if (iVar8 == 0) {
        pMVar20 = pMVar1 + 2;
      }
      if (lVar3 != 0xd8) {
        pMVar20 = pMVar1 + 2;
      }
      if (lVar3 == 0x90) {
        pMVar20 = pMVar10;
      }
      goto LAB_00483e10;
    }
  }
  local_238 = *(void **)((long)pMVar1 + lVar3 + -0x48);
  local_218 = *(int **)((long)pMVar1 + lVar3 + -0x40);
  local_230 = *(long *)((long)pMVar1 + lVar3 + -0x38);
  local_210 = *(long **)((long)pMVar1 + lVar3 + -0x28);
  local_204 = *(int *)((long)pMVar1 + lVar3 + -0x20);
  iVar8 = *(int *)((long)pMVar1 + lVar3 + -0x1c);
  local_200 = *(long *)((long)pMVar1 + lVar3 + -8);
  if (local_218 == (int *)0x0) {
    local_218 = (int *)0x0;
  }
  else {
    LOCK();
    *local_218 = *local_218 + 1;
    UNLOCK();
  }
LAB_00483ed1:
  local_1f0 = &this->attn_mask;
  _h = pMVar1->h;
  _h_00 = pMVar11->h;
  _w = this->embed_dim / this->num_heads;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->embed_dim,_h,4,opt->blob_allocator);
  iVar14 = -1;
  if ((this_00->data != (void *)0x0) &&
     (local_1a0 = this_00, (long)this_00->c * this_00->cstep != 0)) {
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    local_170 = pMVar1;
    Mat::create(&local_c8,_w,_h,this->num_heads,4,opt->workspace_allocator);
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    Mat::create(&local_118,_w,_h_00,this->num_heads,4,opt->workspace_allocator);
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,_h_00,_w,this->num_heads,4,opt->workspace_allocator);
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elempack = 0;
    local_1e8.allocator = (Allocator *)0x0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
    Mat::create(&local_1e8,_h_00,_h,this->num_heads,4,opt->workspace_allocator);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,_w,this->num_heads,_h,4,opt->workspace_allocator);
    auVar25._4_4_ = extraout_XMM0_Db;
    auVar25._0_4_ = (float)(int)_w;
    auVar25._8_4_ = extraout_XMM0_Dc;
    auVar25._12_4_ = extraout_XMM0_Dd;
    auVar25 = rsqrtss(in_XMM1,auVar25);
    fVar24 = auVar25._0_4_;
    uVar16 = 0;
    if (0 < (int)_w) {
      uVar16 = (ulong)_w;
    }
    uVar17 = (ulong)_h;
    if ((int)_h < 1) {
      uVar17 = 0;
    }
    local_228 = 0;
    uVar7 = (ulong)_h_00;
    if ((int)_h_00 < 1) {
      uVar7 = 0;
    }
    local_190 = (long)(int)_w;
    local_198 = local_190 * 4;
    local_188 = iVar8 * local_230;
    for (lVar3 = 0; lVar3 < this->num_heads; lVar3 = lVar3 + 1) {
      lVar4 = lVar3 * local_190;
      for (uVar12 = 0; uVar12 != uVar17; uVar12 = uVar12 + 1) {
        iVar8 = this->embed_dim;
        pvVar6 = (this->q_bias_data).data;
        iVar14 = 0;
        if (0 < iVar8) {
          iVar14 = iVar8;
        }
        pvVar15 = (void *)(local_228 * iVar8 + (long)(this->q_weight_data).data);
        for (uVar21 = 0; uVar21 != uVar16; uVar21 = uVar21 + 1) {
          fVar22 = *(float *)((long)pvVar6 + (uVar21 + lVar4) * 4);
          for (lVar18 = 0; iVar14 != (int)lVar18; lVar18 = lVar18 + 1) {
            fVar22 = fVar22 + *(float *)((long)pvVar15 + lVar18 * 4) *
                              *(float *)((long)local_170->data +
                                        lVar18 * 4 +
                                        local_170->elemsize * uVar12 * (long)local_170->w);
          }
          *(float *)((long)local_c8.data +
                    uVar21 * 4 +
                    (long)local_c8.w *
                    CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) * uVar12 +
                    local_c8.cstep * lVar3 *
                    CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)) =
               fVar22 * fVar24 * -0.5 * ((float)(int)_w * fVar24 * fVar24 + -3.0);
          pvVar15 = (void *)((long)pvVar15 + (long)iVar8 * 4);
        }
      }
      for (uVar12 = 0; uVar12 != uVar7; uVar12 = uVar12 + 1) {
        iVar8 = this->kdim;
        pvVar6 = (this->k_bias_data).data;
        iVar14 = 0;
        if (0 < iVar8) {
          iVar14 = iVar8;
        }
        pvVar15 = (void *)(local_228 * iVar8 + (long)(this->k_weight_data).data);
        for (uVar21 = 0; uVar21 != uVar16; uVar21 = uVar21 + 1) {
          fVar22 = *(float *)((long)pvVar6 + (uVar21 + lVar4) * 4);
          for (lVar18 = 0; iVar14 != (int)lVar18; lVar18 = lVar18 + 1) {
            fVar22 = fVar22 + *(float *)((long)pvVar15 + lVar18 * 4) *
                              *(float *)((long)pMVar11->data +
                                        lVar18 * 4 + pMVar11->elemsize * uVar12 * (long)pMVar11->w);
          }
          *(float *)((long)local_118.data +
                    uVar21 * 4 +
                    (long)local_118.w *
                    CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) * uVar12 +
                    local_118.cstep * lVar3 *
                    CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize)) = fVar22;
          pvVar15 = (void *)((long)pvVar15 + (long)iVar8 * 4);
        }
      }
      lVar18 = local_228;
      for (uVar12 = 0; uVar12 != uVar16; uVar12 = uVar12 + 1) {
        iVar8 = this->vdim;
        pvVar6 = (this->v_bias_data).data;
        iVar14 = 0;
        if (0 < iVar8) {
          iVar14 = iVar8;
        }
        pvVar15 = (this->v_weight_data).data;
        for (uVar21 = 0; uVar21 != uVar7; uVar21 = uVar21 + 1) {
          fVar22 = *(float *)((long)pvVar6 + (uVar12 + lVar4) * 4);
          for (lVar19 = 0; iVar14 != (int)lVar19; lVar19 = lVar19 + 1) {
            fVar22 = fVar22 + *(float *)((long)pvVar15 + lVar19 * 4 + iVar8 * lVar18) *
                              *(float *)((long)pMVar20->data +
                                        lVar19 * 4 + pMVar20->elemsize * uVar21 * (long)pMVar20->w);
          }
          *(float *)((long)local_168.data +
                    uVar21 * 4 +
                    (long)local_168.w *
                    CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize) * uVar12 +
                    local_168.cstep * lVar3 *
                    CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize)) = fVar22;
        }
        lVar18 = lVar18 + 4;
      }
      pvVar6 = (void *)(CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                        local_c8.cstep * lVar3 + (long)local_c8.data);
      for (uVar12 = 0; uVar12 != uVar17; uVar12 = uVar12 + 1) {
        pvVar15 = (void *)(local_118.cstep *
                           CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) * lVar3
                          + (long)local_118.data);
        for (uVar21 = 0; uVar21 != uVar7; uVar21 = uVar21 + 1) {
          fVar22 = 0.0;
          for (lVar4 = 0; (int)uVar16 != (int)lVar4; lVar4 = lVar4 + 1) {
            fVar22 = fVar22 + *(float *)((long)pvVar15 + lVar4 * 4) *
                              *(float *)((long)pvVar6 + lVar4 * 4);
          }
          *(float *)((long)local_1e8.data +
                    uVar21 * 4 +
                    (long)local_1e8.w *
                    CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize) * uVar12 +
                    local_1e8.cstep * lVar3 *
                    CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize)) = fVar22;
          pvVar15 = (void *)((long)pvVar15 +
                            (long)local_118.w *
                            CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize));
        }
        pvVar6 = (void *)((long)pvVar6 +
                         (long)local_c8.w *
                         CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
      }
      if (*local_1f0 != 0) {
        if (local_204 == 3) {
          piVar5 = (int *)0x0;
          pvVar6 = (void *)(local_200 * local_230 * lVar3 + (long)local_238);
        }
        else {
          pvVar6 = local_238;
          if (local_218 == (int *)0x0) {
            piVar5 = (int *)0x0;
          }
          else {
            LOCK();
            *local_218 = *local_218 + 1;
            UNLOCK();
            piVar5 = local_218;
          }
        }
        pvVar9 = (void *)(CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize) *
                          local_1e8.cstep * lVar3 + (long)local_1e8.data);
        pvVar15 = pvVar6;
        for (uVar12 = 0; uVar12 != uVar17; uVar12 = uVar12 + 1) {
          for (uVar21 = 0; uVar7 != uVar21; uVar21 = uVar21 + 1) {
            *(float *)((long)pvVar9 + uVar21 * 4) =
                 *(float *)((long)pvVar9 + uVar21 * 4) + *(float *)((long)pvVar15 + uVar21 * 4);
          }
          pvVar9 = (void *)((long)pvVar9 +
                           (long)local_1e8.w *
                           CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize));
          pvVar15 = (void *)((long)pvVar15 + local_188);
        }
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_210 == (long *)0x0) {
              free(pvVar6);
            }
            else {
              (**(code **)(*local_210 + 0x18))();
            }
          }
        }
      }
      local_180 = (long)local_1e8.w *
                  CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
      pvVar6 = (void *)(CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize) *
                        local_1e8.cstep * lVar3 + (long)local_1e8.data);
      uVar12 = 0;
      while (uVar12 != uVar17) {
        auVar26._0_12_ = ZEXT812(0xff7fffff);
        auVar26._12_4_ = 0;
        for (uVar21 = 0; fVar22 = auVar26._0_4_, uVar7 != uVar21; uVar21 = uVar21 + 1) {
          fVar27 = *(float *)((long)pvVar6 + uVar21 * 4);
          if (fVar22 <= fVar27) {
            auVar26._0_4_ = fVar27;
          }
        }
        fVar27 = 0.0;
        local_178 = uVar12;
        for (uVar21 = 0; uVar7 != uVar21; uVar21 = uVar21 + 1) {
          fVar23 = expf(*(float *)((long)pvVar6 + uVar21 * 4) - auVar26._0_4_);
          auVar26 = ZEXT416((uint)fVar22);
          *(float *)((long)pvVar6 + uVar21 * 4) = fVar23;
          fVar27 = fVar27 + fVar23;
        }
        for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
          *(float *)((long)pvVar6 + uVar12 * 4) =
               *(float *)((long)pvVar6 + uVar12 * 4) * (1.0 / fVar27);
        }
        pvVar6 = (void *)((long)pvVar6 + local_180);
        uVar12 = local_178 + 1;
      }
      pvVar6 = (void *)(local_1e8.cstep *
                        CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize) * lVar3 +
                       (long)local_1e8.data);
      for (uVar12 = 0; uVar12 != uVar17; uVar12 = uVar12 + 1) {
        pvVar15 = (void *)(local_168.cstep *
                           CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize) * lVar3
                          + (long)local_168.data);
        for (uVar21 = 0; uVar21 != uVar16; uVar21 = uVar21 + 1) {
          fVar22 = 0.0;
          for (lVar4 = 0; (int)uVar7 != (int)lVar4; lVar4 = lVar4 + 1) {
            fVar22 = fVar22 + *(float *)((long)pvVar15 + lVar4 * 4) *
                              *(float *)((long)pvVar6 + lVar4 * 4);
          }
          *(float *)((long)local_78.data +
                    uVar21 * 4 +
                    local_78.cstep * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize)
                    * uVar12 +
                    local_78.w * lVar3 *
                    CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize)) = fVar22;
          pvVar15 = (void *)((long)pvVar15 +
                            (long)local_168.w *
                            CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize));
        }
        pvVar6 = (void *)((long)pvVar6 +
                         (long)local_1e8.w *
                         CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize));
      }
      local_228 = local_228 + local_198;
    }
    uVar7 = 0;
    uVar16 = (ulong)(uint)this->embed_dim;
    if (this->embed_dim < 1) {
      uVar16 = uVar7;
    }
    for (; uVar7 != uVar17; uVar7 = uVar7 + 1) {
      iVar8 = local_1a0->w;
      sVar2 = local_1a0->elemsize;
      pvVar6 = local_1a0->data;
      pvVar15 = (this->out_weight_data).data;
      iVar14 = this->embed_dim;
      iVar13 = 0;
      if (0 < iVar14) {
        iVar13 = iVar14;
      }
      pvVar9 = (this->out_bias_data).data;
      for (uVar12 = 0; uVar12 != uVar16; uVar12 = uVar12 + 1) {
        fVar24 = *(float *)((long)pvVar9 + uVar12 * 4);
        for (lVar3 = 0; iVar13 != (int)lVar3; lVar3 = lVar3 + 1) {
          fVar24 = fVar24 + *(float *)((long)pvVar15 + lVar3 * 4) *
                            *(float *)((long)local_78.data +
                                      lVar3 * 4 +
                                      local_78.cstep *
                                      CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize
                                              ) * uVar7);
        }
        *(float *)((long)pvVar6 + uVar12 * 4 + (long)iVar8 * uVar7 * sVar2) = fVar24;
        pvVar15 = (void *)((long)pvVar15 + (long)iVar14 * 4);
      }
    }
    piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar5 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) {
          free(local_1e8.data);
        }
        else {
          (*(local_1e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar5 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          free(local_168.data);
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          free(local_118.data);
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar5 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          free(local_c8.data);
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar14 = 0;
  }
  if (local_218 != (int *)0x0) {
    LOCK();
    *local_218 = *local_218 + -1;
    UNLOCK();
    if (*local_218 == 0) {
      if (local_210 == (long *)0x0) {
        free(local_238);
      }
      else {
        (**(code **)(*local_210 + 0x18))(local_210,local_238);
      }
    }
  }
  return iVar14;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    const int src_seqlen = q_blob.h;
    const int dst_seqlen = k_blob.h;
    const int embed_dim_per_head = embed_dim / num_heads;

    // assert k_blob.h == v_blob.h

    Mat& top_blob = top_blobs[0];
    top_blob.create(embed_dim, src_seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -1;

    Mat xq(embed_dim_per_head, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    Mat xk(embed_dim_per_head, dst_seqlen, num_heads, 4u, opt.workspace_allocator);
    Mat xv(dst_seqlen, embed_dim_per_head, num_heads, 4u, opt.workspace_allocator);

    Mat xqk(dst_seqlen, src_seqlen, num_heads, 4u, opt.workspace_allocator);

    Mat xqkv(embed_dim_per_head, num_heads, src_seqlen, 4u, opt.workspace_allocator);

    const float inv_sqrt_embed_dim_per_head = 1.f / sqrtf(embed_dim_per_head);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_heads; q++)
    {
        // xq = affine(q) * inv_sqrt_embed_dim_per_head
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * inv_sqrt_embed_dim_per_head;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < dst_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + kdim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < kdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + vdim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < vdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, src_seqlen)
        // xk  (embed_dim_per_head, dst_seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xqk + mask
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob.dims == 3 ? attn_mask_blob.channel(q) : attn_mask_blob;
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                const float* mptr = maskm.row(i);
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    outptr[j] += mptr[j];
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] = (float)(expf(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (dst_seqlen, src_seqlen)
        // xv  (dst_seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_heads, src_seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < dst_seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, src_seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < src_seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < embed_dim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}